

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io_util.hpp
# Opt level: O2

bool file_io::is_frontmatter_tag(string *__line)

{
  bool bVar1;
  regex __frontmatter_tags;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&__frontmatter_tags,"^\\s*(?:---|\\+\\+\\+|\\{|\\})\\s*$",0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (__line,&__frontmatter_tags,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&__frontmatter_tags);
  return bVar1;
}

Assistant:

bool is_frontmatter_tag(std::string __line) {
		std::regex __frontmatter_tags("^\\s*(?:---|\\+\\+\\+|\\{|\\})\\s*$");
		if (std::regex_match(__line, __frontmatter_tags))
			return true;
		else
			return false;
	}